

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImPool<ImGuiTable>::Clear(ImPool<ImGuiTable> *this)

{
  int *piVar1;
  uint uVar2;
  ImGuiTable *pIVar3;
  long lVar4;
  long lVar5;
  
  if (0 < (this->Map).Data.Size) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      uVar2 = *(uint *)((long)&((this->Map).Data.Data)->key + lVar4);
      if ((ulong)uVar2 != 0xffffffff) {
        if (((int)uVar2 < 0) || ((this->Buf).Size <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                        ,0x706,"T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]");
        }
        ImGuiTable::~ImGuiTable((this->Buf).Data + uVar2);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < (this->Map).Data.Size);
  }
  ImGuiStorage::Clear(&this->Map);
  pIVar3 = (this->Buf).Data;
  if (pIVar3 != (ImGuiTable *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    (this->Buf).Data = (ImGuiTable *)0x0;
  }
  this->FreeIdx = 0;
  this->AliveCount = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = AliveCount = 0; }